

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_WoW6.cpp
# Opt level: O0

int __thiscall
TRootHandler_WoW6::ParseWowRootFile_Level1
          (TRootHandler_WoW6 *this,LPBYTE pbRootPtr,LPBYTE pbRootEnd,DWORD dwLocaleMask,
          BYTE bAudioLocale)

{
  BYTE bAudioLocale_local;
  DWORD dwLocaleMask_local;
  LPBYTE pbRootEnd_local;
  LPBYTE pbRootPtr_local;
  TRootHandler_WoW6 *this_local;
  
  ParseWowRootFile_Level2(this,pbRootPtr,pbRootEnd,dwLocaleMask,'\0',bAudioLocale);
  if (dwLocaleMask == 0x200) {
    ParseWowRootFile_Level2(this,pbRootPtr,pbRootEnd,2,'\0',bAudioLocale);
  }
  if (dwLocaleMask == 0x10000) {
    ParseWowRootFile_Level2(this,pbRootPtr,pbRootEnd,0x4000,'\0',bAudioLocale);
  }
  return 0;
}

Assistant:

int ParseWowRootFile_Level1(
        LPBYTE pbRootPtr,
        LPBYTE pbRootEnd,
        DWORD dwLocaleMask,
        BYTE bAudioLocale)
    {
        // Load the locale as-is
        ParseWowRootFile_Level2(pbRootPtr, pbRootEnd, dwLocaleMask, false, bAudioLocale);

        // If we wanted enGB, we also load enUS for the missing files
        if(dwLocaleMask == CASC_LOCALE_ENGB)
            ParseWowRootFile_Level2(pbRootPtr, pbRootEnd, CASC_LOCALE_ENUS, false, bAudioLocale);

        if(dwLocaleMask == CASC_LOCALE_PTPT)
            ParseWowRootFile_Level2(pbRootPtr, pbRootEnd, CASC_LOCALE_PTBR, false, bAudioLocale);

        return ERROR_SUCCESS;
    }